

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

PortPackedStruct * __thiscall
kratos::Generator::port_packed
          (Generator *this,PortDirection direction,string *port_name,
          shared_ptr<kratos::PackedStruct> *packed_struct_,uint32_t size)

{
  initializer_list<unsigned_int> __l;
  PortPackedStruct *pPVar1;
  allocator<unsigned_int> local_5d;
  uint32_t local_5c;
  iterator local_58;
  size_type local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  uint32_t local_2c;
  shared_ptr<kratos::PackedStruct> *psStack_28;
  uint32_t size_local;
  shared_ptr<kratos::PackedStruct> *packed_struct__local;
  string *port_name_local;
  Generator *pGStack_10;
  PortDirection direction_local;
  Generator *this_local;
  
  local_58 = &local_5c;
  local_50 = 1;
  local_5c = size;
  local_2c = size;
  psStack_28 = packed_struct_;
  packed_struct__local = (shared_ptr<kratos::PackedStruct> *)port_name;
  port_name_local._4_4_ = direction;
  pGStack_10 = this;
  std::allocator<unsigned_int>::allocator(&local_5d);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__l,&local_5d);
  pPVar1 = port_packed(this,direction,port_name,packed_struct_,&local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
  std::allocator<unsigned_int>::~allocator(&local_5d);
  return pPVar1;
}

Assistant:

PortPackedStruct &Generator::port_packed(PortDirection direction, const std::string &port_name,
                                         const std::shared_ptr<PackedStruct> &packed_struct_,
                                         uint32_t size) {
    return port_packed(direction, port_name, packed_struct_, std::vector<uint32_t>{size});
}